

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int SplitNode(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell,int iHeight)

{
  bool bVar1;
  int iVar2;
  RtreeCell *aCell_00;
  i64 iVar3;
  i64 iRowid_1;
  i64 iRowid;
  RtreeNode *pRStack_c0;
  int iCell;
  RtreeNode *pParent;
  RtreeCell rightbbox;
  RtreeCell leftbbox;
  RtreeNode *pRight;
  RtreeNode *pLeft;
  int *aiUsed;
  RtreeCell *aCell;
  int local_30;
  int nCell;
  int rc;
  int newCellIsRight;
  int i;
  int iHeight_local;
  RtreeCell *pCell_local;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  bVar1 = false;
  iVar2 = readInt16(pNode->zData + 2);
  pRight = (RtreeNode *)0x0;
  leftbbox.aCoord[8] = (RtreeCoord)0x0;
  leftbbox.aCoord[9] = (RtreeCoord)0x0;
  aCell_00 = (RtreeCell *)sqlite3_malloc64((long)(iVar2 + 1) * 0x34);
  if (aCell_00 == (RtreeCell *)0x0) {
    local_30 = 7;
  }
  else {
    memset(aCell_00 + (iVar2 + 1),0,(long)(iVar2 + 1) << 2);
    for (rc = 0; rc < iVar2; rc = rc + 1) {
      nodeGetCell(pRtree,pNode,rc,aCell_00 + rc);
    }
    nodeZero(pRtree,pNode);
    memcpy(aCell_00 + iVar2,pCell,0x30);
    if (pNode->iNode == 1) {
      leftbbox.aCoord._32_8_ = nodeNew(pRtree,pNode);
      pRight = nodeNew(pRtree,pNode);
      pRtree->iDepth = pRtree->iDepth + 1;
      pNode->isDirty = 1;
      writeInt16(pNode->zData,pRtree->iDepth);
    }
    else {
      leftbbox.aCoord._32_8_ = nodeNew(pRtree,pNode->pParent);
      pNode->nRef = pNode->nRef + 1;
      pRight = pNode;
    }
    if ((pRight == (RtreeNode *)0x0) || (leftbbox.aCoord._32_8_ == 0)) {
      local_30 = 7;
    }
    else {
      memset(pRight->zData,0,(long)pRtree->iNodeSize);
      memset(*(void **)(leftbbox.aCoord._32_8_ + 0x18),0,(long)pRtree->iNodeSize);
      local_30 = splitNodeStartree(pRtree,aCell_00,iVar2 + 1,pRight,
                                   (RtreeNode *)leftbbox.aCoord._32_8_,
                                   (RtreeCell *)(rightbbox.aCoord + 8),(RtreeCell *)&pParent);
      if (((local_30 == 0) &&
          (local_30 = nodeWrite(pRtree,(RtreeNode *)leftbbox.aCoord._32_8_), local_30 == 0)) &&
         ((pRight->iNode != 0 || (local_30 = nodeWrite(pRtree,pRight), local_30 == 0)))) {
        pParent = *(RtreeNode **)(leftbbox.aCoord._32_8_ + 8);
        rightbbox.aCoord._32_8_ = pRight->iNode;
        if (pNode->iNode == 1) {
          local_30 = rtreeInsertCell(pRtree,pRight->pParent,(RtreeCell *)(rightbbox.aCoord + 8),
                                     iHeight + 1);
        }
        else {
          pRStack_c0 = pRight->pParent;
          local_30 = nodeParentIndex(pRtree,pRight,(int *)((long)&iRowid + 4));
          if (local_30 == 0) {
            nodeOverwriteCell(pRtree,pRStack_c0,(RtreeCell *)(rightbbox.aCoord + 8),iRowid._4_4_);
            local_30 = AdjustTree(pRtree,pRStack_c0,(RtreeCell *)(rightbbox.aCoord + 8));
          }
        }
        if ((local_30 == 0) &&
           (local_30 = rtreeInsertCell(pRtree,*(RtreeNode **)leftbbox.aCoord._32_8_,
                                       (RtreeCell *)&pParent,iHeight + 1), local_30 == 0)) {
          for (rc = 0; iVar2 = readInt16((u8 *)(*(long *)(leftbbox.aCoord._32_8_ + 0x18) + 2)),
              rc < iVar2; rc = rc + 1) {
            iVar3 = nodeGetRowid(pRtree,(RtreeNode *)leftbbox.aCoord._32_8_,rc);
            local_30 = updateMapping(pRtree,iVar3,(RtreeNode *)leftbbox.aCoord._32_8_,iHeight);
            if (iVar3 == pCell->iRowid) {
              bVar1 = true;
            }
            if (local_30 != 0) goto LAB_00235ce5;
          }
          if (pNode->iNode == 1) {
            for (rc = 0; iVar2 = readInt16(pRight->zData + 2), rc < iVar2; rc = rc + 1) {
              iVar3 = nodeGetRowid(pRtree,pRight,rc);
              local_30 = updateMapping(pRtree,iVar3,pRight,iHeight);
              if (local_30 != 0) goto LAB_00235ce5;
            }
          }
          else if (!bVar1) {
            local_30 = updateMapping(pRtree,pCell->iRowid,pRight,iHeight);
          }
          if (local_30 == 0) {
            local_30 = nodeRelease(pRtree,(RtreeNode *)leftbbox.aCoord._32_8_);
            leftbbox.aCoord[8] = (RtreeCoord)0x0;
            leftbbox.aCoord[9] = (RtreeCoord)0x0;
          }
          if (local_30 == 0) {
            local_30 = nodeRelease(pRtree,pRight);
            pRight = (RtreeNode *)0x0;
          }
        }
      }
    }
  }
LAB_00235ce5:
  nodeRelease(pRtree,(RtreeNode *)leftbbox.aCoord._32_8_);
  nodeRelease(pRtree,pRight);
  sqlite3_free(aCell_00);
  return local_30;
}

Assistant:

static int SplitNode(
  Rtree *pRtree,
  RtreeNode *pNode,
  RtreeCell *pCell,
  int iHeight
){
  int i;
  int newCellIsRight = 0;

  int rc = SQLITE_OK;
  int nCell = NCELL(pNode);
  RtreeCell *aCell;
  int *aiUsed;

  RtreeNode *pLeft = 0;
  RtreeNode *pRight = 0;

  RtreeCell leftbbox;
  RtreeCell rightbbox;

  /* Allocate an array and populate it with a copy of pCell and 
  ** all cells from node pLeft. Then zero the original node.
  */
  aCell = sqlite3_malloc64((sizeof(RtreeCell)+sizeof(int))*(nCell+1));
  if( !aCell ){
    rc = SQLITE_NOMEM;
    goto splitnode_out;
  }
  aiUsed = (int *)&aCell[nCell+1];
  memset(aiUsed, 0, sizeof(int)*(nCell+1));
  for(i=0; i<nCell; i++){
    nodeGetCell(pRtree, pNode, i, &aCell[i]);
  }
  nodeZero(pRtree, pNode);
  memcpy(&aCell[nCell], pCell, sizeof(RtreeCell));
  nCell++;

  if( pNode->iNode==1 ){
    pRight = nodeNew(pRtree, pNode);
    pLeft = nodeNew(pRtree, pNode);
    pRtree->iDepth++;
    pNode->isDirty = 1;
    writeInt16(pNode->zData, pRtree->iDepth);
  }else{
    pLeft = pNode;
    pRight = nodeNew(pRtree, pLeft->pParent);
    pLeft->nRef++;
  }

  if( !pLeft || !pRight ){
    rc = SQLITE_NOMEM;
    goto splitnode_out;
  }

  memset(pLeft->zData, 0, pRtree->iNodeSize);
  memset(pRight->zData, 0, pRtree->iNodeSize);

  rc = splitNodeStartree(pRtree, aCell, nCell, pLeft, pRight,
                         &leftbbox, &rightbbox);
  if( rc!=SQLITE_OK ){
    goto splitnode_out;
  }

  /* Ensure both child nodes have node numbers assigned to them by calling
  ** nodeWrite(). Node pRight always needs a node number, as it was created
  ** by nodeNew() above. But node pLeft sometimes already has a node number.
  ** In this case avoid the all to nodeWrite().
  */
  if( SQLITE_OK!=(rc = nodeWrite(pRtree, pRight))
   || (0==pLeft->iNode && SQLITE_OK!=(rc = nodeWrite(pRtree, pLeft)))
  ){
    goto splitnode_out;
  }

  rightbbox.iRowid = pRight->iNode;
  leftbbox.iRowid = pLeft->iNode;

  if( pNode->iNode==1 ){
    rc = rtreeInsertCell(pRtree, pLeft->pParent, &leftbbox, iHeight+1);
    if( rc!=SQLITE_OK ){
      goto splitnode_out;
    }
  }else{
    RtreeNode *pParent = pLeft->pParent;
    int iCell;
    rc = nodeParentIndex(pRtree, pLeft, &iCell);
    if( rc==SQLITE_OK ){
      nodeOverwriteCell(pRtree, pParent, &leftbbox, iCell);
      rc = AdjustTree(pRtree, pParent, &leftbbox);
    }
    if( rc!=SQLITE_OK ){
      goto splitnode_out;
    }
  }
  if( (rc = rtreeInsertCell(pRtree, pRight->pParent, &rightbbox, iHeight+1)) ){
    goto splitnode_out;
  }

  for(i=0; i<NCELL(pRight); i++){
    i64 iRowid = nodeGetRowid(pRtree, pRight, i);
    rc = updateMapping(pRtree, iRowid, pRight, iHeight);
    if( iRowid==pCell->iRowid ){
      newCellIsRight = 1;
    }
    if( rc!=SQLITE_OK ){
      goto splitnode_out;
    }
  }
  if( pNode->iNode==1 ){
    for(i=0; i<NCELL(pLeft); i++){
      i64 iRowid = nodeGetRowid(pRtree, pLeft, i);
      rc = updateMapping(pRtree, iRowid, pLeft, iHeight);
      if( rc!=SQLITE_OK ){
        goto splitnode_out;
      }
    }
  }else if( newCellIsRight==0 ){
    rc = updateMapping(pRtree, pCell->iRowid, pLeft, iHeight);
  }

  if( rc==SQLITE_OK ){
    rc = nodeRelease(pRtree, pRight);
    pRight = 0;
  }
  if( rc==SQLITE_OK ){
    rc = nodeRelease(pRtree, pLeft);
    pLeft = 0;
  }

splitnode_out:
  nodeRelease(pRtree, pRight);
  nodeRelease(pRtree, pLeft);
  sqlite3_free(aCell);
  return rc;
}